

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

void __thiscall
ProString::
ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<char_const(&)[4],ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>,char_const(&)[2]>,ProString>
          (ProString *this,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
          *str)

{
  long lVar1;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>,_const_char_(&)[2]>,_ProString>
  *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffffb8);
  ProString(in_RDI,(QString *)in_stack_ffffffffffffffb8);
  QString::~QString((QString *)0x2265f7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString(const QStringBuilder<A, B> &str)
        : ProString(QString(str))
    {}